

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::LE_DeadReckoningParameter
          (LE_DeadReckoningParameter *this,DeadReckoningAlgorithm DRA,
          LE_Vector8_3 *LinearAcceleration,LE_Vector8_3 *AngularVelocity)

{
  LE_Vector8_3 *AngularVelocity_local;
  LE_Vector8_3 *LinearAcceleration_local;
  DeadReckoningAlgorithm DRA_local;
  LE_DeadReckoningParameter *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_DeadReckoningParameter_004f2f18;
  this->m_ui8DeadRecknoningAlgorithm = (KUINT8)DRA;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_LinearAcceleration,LinearAcceleration);
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_AngularVelocity,AngularVelocity);
  return;
}

Assistant:

LE_DeadReckoningParameter::LE_DeadReckoningParameter( DeadReckoningAlgorithm DRA, const LE_Vector8_3 & LinearAcceleration,
        const LE_Vector8_3 & AngularVelocity ) :
    m_ui8DeadRecknoningAlgorithm( DRA ),
    m_LinearAcceleration( LinearAcceleration ),
    m_AngularVelocity( AngularVelocity )
{
}